

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O1

void __thiscall Knn::run(Knn *this)

{
  priority_queue<std::pair<double,_KdtreeNode_*>,_std::vector<std::pair<double,_KdtreeNode_*>,_std::allocator<std::pair<double,_KdtreeNode_*>_>_>,_std::less<std::pair<double,_KdtreeNode_*>_>_>
  *this_00;
  vector<double,_std::allocator<double>_> *pvVar1;
  double *pdVar2;
  KdtreeNode *pKVar3;
  KdtreeNode *pKVar4;
  ostream *poVar5;
  vector<double,_std::allocator<double>_> *testD;
  double *c;
  double *pdVar6;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"../data/perceptrondata.txt","");
  (**(this->super_Base)._vptr_Base)(this,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  local_50[0] = (undefined1 *)CONCAT44(local_50[0]._4_4_,0x3f19999a);
  createTrainTest(this,(float *)local_50);
  createSplitAxis(this);
  setRoot(this);
  pKVar3 = buildTree(this,this->root,&this->root->leftTreeVal,&this->axisVec);
  pKVar4 = this->root;
  pKVar4->left = pKVar3;
  pKVar4 = buildTree(this,pKVar4,&pKVar4->rightTreeVal,&this->axisVec);
  this->root->right = pKVar4;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"show the tree in preorder traversal.",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  showTree(this,this->root);
  this->K = 2;
  testD = (this->super_Base).testData.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->super_Base).testData.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (testD != pvVar1) {
    this_00 = &this->maxHeap;
    do {
      findKNearest(this,testD);
      while (*(long *)&this->maxHeap != *(long *)&this->field_0x120) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dis: ",5);
        std::ostream::_M_insert<double>(**(double **)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," val: ",6);
        pdVar2 = (double *)(*(undefined8 **)(*(long *)this_00 + 8))[1];
        for (pdVar6 = (double *)**(undefined8 **)(*(long *)this_00 + 8); pdVar6 != pdVar2;
            pdVar6 = pdVar6 + 1) {
          poVar5 = std::ostream::_M_insert<double>(*pdVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
        std::
        priority_queue<std::pair<double,_KdtreeNode_*>,_std::vector<std::pair<double,_KdtreeNode_*>,_std::allocator<std::pair<double,_KdtreeNode_*>_>_>,_std::less<std::pair<double,_KdtreeNode_*>_>_>
        ::pop(this_00);
      }
      testD = testD + 1;
    } while (testD != pvVar1);
  }
  return;
}

Assistant:

void Knn::run(){
    getData("../data/perceptrondata.txt");
    createTrainTest(0.6);
    createSplitAxis();
    setRoot();
    root->left = buildTree(root, root->leftTreeVal, axisVec);
    root->right = buildTree(root, root->rightTreeVal, axisVec);
    cout<<"show the tree in preorder traversal."<<endl;
    showTree(root);
    setK(2);
    for(auto& a:testData) {
        findKNearest(a);
        while (!maxHeap.empty()) {
            cout << "dis: " << maxHeap.top().first;
            cout << " val: ";
            for (auto &c :maxHeap.top().second->val)
                cout << c << " ";
            cout << endl;
            maxHeap.pop();
        }
    }
}